

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

void af_cjk_hint_edges(AF_GlyphHints hints,AF_Dimension dim)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  AF_Edge_conflict pAVar4;
  AF_Edge pAVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  AF_Edge_conflict pAVar9;
  AF_Edge_conflict pAVar10;
  FT_Pos FVar11;
  FT_Pos FVar12;
  AF_Edge_conflict pAVar13;
  AF_Edge_conflict pAVar14;
  long lVar15;
  FT_Long FVar16;
  ulong uVar17;
  long lVar18;
  AF_Edge_conflict pAVar19;
  AF_Edge_conflict pAVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  AF_Edge_conflict pAVar24;
  int iVar25;
  AF_Edge_conflict local_58;
  FT_Pos local_48;
  
  pAVar4 = hints->axis[dim].edges;
  if (pAVar4 == (AF_Edge_conflict)0x0) {
    pAVar19 = (AF_Edge_conflict)0x0;
LAB_00269660:
    bVar7 = false;
    iVar25 = 0;
  }
  else {
    uVar3 = hints->axis[dim].num_edges;
    uVar17 = (ulong)uVar3;
    pAVar19 = pAVar4 + uVar17;
    bVar7 = uVar17 != 0;
    if (uVar17 == 0) goto LAB_00269660;
    pAVar13 = (AF_Edge_conflict)0x0;
    pAVar24 = pAVar4;
    do {
      if ((pAVar24->flags & 4) == 0) {
        pAVar20 = pAVar24->link;
        if (pAVar24->blue_edge == (AF_Width)0x0) {
          if ((pAVar20 != (AF_Edge_conflict)0x0) && (pAVar20->blue_edge != (AF_Width)0x0)) {
            FVar12 = pAVar20->blue_edge->fit;
            pAVar20->pos = FVar12;
            pAVar20->flags = pAVar20->flags | 4;
            pAVar10 = pAVar20;
            pAVar20 = pAVar24;
            goto LAB_002694b1;
          }
        }
        else {
          FVar12 = pAVar24->blue_edge->fit;
          pAVar24->pos = FVar12;
          pAVar24->flags = pAVar24->flags | 4;
          if ((pAVar20 != (AF_Edge_conflict)0x0) &&
             (pAVar10 = pAVar24, pAVar20->blue_edge == (AF_Width)0x0)) {
LAB_002694b1:
            bVar1 = pAVar20->flags;
            FVar11 = af_cjk_compute_stem_width
                               ((AF_GlyphHints)(ulong)hints->other_flags,
                                (AF_Dimension)hints->metrics,(ulong)dim,
                                (int)pAVar20->opos - (int)pAVar10->opos,(FT_UInt)pAVar13);
            pAVar20->pos = FVar11 + FVar12;
            pAVar20->flags = bVar1 | 4;
          }
          if (pAVar13 == (AF_Edge_conflict)0x0) {
            pAVar13 = pAVar24;
          }
        }
      }
      pAVar24 = pAVar24 + 1;
    } while (pAVar24 < pAVar19);
    if (uVar3 == 0) goto LAB_00269660;
    local_48 = 0;
    FVar12 = 0;
    bVar8 = false;
    iVar25 = 0;
    pAVar24 = pAVar4;
    local_58 = pAVar13;
    do {
      bVar1 = pAVar24->flags;
      if ((bVar1 & 4) == 0) {
        pAVar20 = pAVar24->link;
        if ((pAVar20 == (AF_Edge_conflict)0x0) ||
           ((bVar8 && ((pAVar24->pos < FVar12 + 0x40 || (pAVar20->pos < FVar12 + 0x40)))))) {
          iVar25 = iVar25 + 1;
        }
        else if (pAVar20->blue_edge == (AF_Width)0x0) {
          if (pAVar20 < pAVar24) {
            FVar12 = af_cjk_compute_stem_width
                               ((AF_GlyphHints)(ulong)hints->other_flags,
                                (AF_Dimension)hints->metrics,(ulong)dim,
                                (int)pAVar24->opos - (int)pAVar20->opos,(FT_UInt)pAVar13);
            FVar12 = FVar12 + pAVar20->pos;
            pAVar24->pos = FVar12;
            pAVar24->flags = bVar1 | 4;
            bVar8 = true;
          }
          else {
            if ((dim == AF_DIMENSION_VERT) || (local_58 != (AF_Edge_conflict)0x0)) {
              pAVar13 = (AF_Edge_conflict)(ulong)dim;
              af_hint_normal_stem(hints,pAVar24,pAVar20,local_48,dim);
            }
            else {
              pAVar13 = (AF_Edge_conflict)0x0;
              local_48 = af_hint_normal_stem(hints,pAVar24,pAVar20,0,AF_DIMENSION_HORZ);
            }
            pAVar24->flags = pAVar24->flags | 4;
            pAVar20->flags = pAVar20->flags | 4;
            FVar12 = pAVar20->pos;
            bVar8 = true;
            local_58 = pAVar24;
          }
        }
        else {
          FVar11 = af_cjk_compute_stem_width
                             ((AF_GlyphHints)(ulong)hints->other_flags,(AF_Dimension)hints->metrics,
                              (ulong)dim,(int)pAVar24->opos - (int)pAVar20->opos,(FT_UInt)pAVar13);
          pAVar24->pos = FVar11 + pAVar20->pos;
          pAVar24->flags = bVar1 | 4;
        }
      }
      pAVar24 = pAVar24 + 1;
    } while (pAVar24 < pAVar19);
  }
  if (dim == AF_DIMENSION_HORZ) {
    lVar15 = (long)pAVar19 - (long)pAVar4;
    if (lVar15 == 0x210) {
      lVar18 = 0x160;
      lVar21 = 0xb0;
      pAVar13 = pAVar4;
    }
    else {
      if (lVar15 != 0x420) goto LAB_00269671;
      lVar18 = 0x318;
      lVar21 = 0x1b8;
      pAVar13 = pAVar4 + 1;
    }
    uVar22 = *(long *)((long)&pAVar4->opos + lVar21) * 2 -
             (pAVar13->opos + *(long *)((long)&pAVar4->opos + lVar18));
    uVar17 = -uVar22;
    if (0 < (long)uVar22) {
      uVar17 = uVar22;
    }
    if ((pAVar13->link == pAVar13 + 1) &&
       (*(long *)((long)&pAVar4->link + lVar21) == (long)&pAVar4[1].fpos + lVar21)) {
      lVar6 = *(long *)((long)&pAVar4->link + lVar18);
      if ((lVar6 == (long)&pAVar4[1].fpos + lVar18) && (uVar17 < 8)) {
        lVar21 = *(long *)((long)&pAVar4->pos + lVar21) * 2 - pAVar13->pos;
        lVar23 = *(long *)((long)&pAVar4->pos + lVar18) - lVar21;
        *(long *)((long)&pAVar4->pos + lVar18) = lVar21;
        *(long *)(lVar6 + 0x10) = *(long *)(lVar6 + 0x10) - lVar23;
        if (lVar15 == 0x420) {
          pAVar4[8].pos = pAVar4[8].pos - lVar23;
          pAVar4[0xb].pos = pAVar4[0xb].pos - lVar23;
        }
        (&pAVar4->flags)[lVar18] = (&pAVar4->flags)[lVar18] | 4;
        *(byte *)(lVar6 + 0x18) = *(byte *)(lVar6 + 0x18) | 4;
      }
    }
  }
LAB_00269671:
  pAVar13 = pAVar4;
  if (iVar25 != 0 && !(bool)(bVar7 ^ 1U)) {
    do {
      if (((pAVar13->flags & 4) == 0) && (pAVar5 = pAVar13->serif, pAVar5 != (AF_Edge)0x0)) {
        pAVar13->pos = (pAVar5->pos - pAVar5->opos) + pAVar13->opos;
        pAVar13->flags = pAVar13->flags | 4;
        iVar25 = iVar25 + -1;
      }
      pAVar13 = pAVar13 + 1;
    } while (pAVar13 < pAVar19);
    if (iVar25 != 0 && !(bool)(bVar7 ^ 1U)) {
      pAVar13 = pAVar4 + -1;
      pAVar20 = pAVar4;
      pAVar24 = pAVar4;
      do {
        pAVar24 = pAVar24 + 1;
        pAVar10 = pAVar13;
        if ((pAVar20->flags & 4) == 0) {
          do {
            pAVar14 = pAVar10;
            pAVar9 = pAVar24;
            if (pAVar14 < pAVar4) break;
            pAVar10 = pAVar14 + -1;
          } while ((pAVar14->flags & 4) == 0);
          do {
            pAVar10 = pAVar9;
            if (pAVar19 <= pAVar10) {
              if (pAVar14 < pAVar4) goto LAB_0026972b;
              lVar15 = pAVar14->pos - pAVar14->opos;
              goto LAB_00269723;
            }
            pAVar9 = pAVar10 + 1;
          } while ((pAVar10->flags & 4) == 0);
          if (pAVar14 < pAVar4) {
            lVar15 = pAVar10->pos - pAVar10->opos;
LAB_00269723:
            lVar15 = lVar15 + pAVar20->opos;
          }
          else {
            sVar2 = pAVar14->fpos;
            if (pAVar10->fpos == sVar2) {
              lVar15 = pAVar14->pos;
            }
            else {
              lVar15 = pAVar14->pos;
              FVar16 = FT_MulDiv((long)pAVar20->fpos - (long)(int)sVar2,pAVar10->pos - lVar15,
                                 (long)((int)pAVar10->fpos - (int)sVar2));
              lVar15 = FVar16 + lVar15;
            }
          }
          pAVar20->pos = lVar15;
        }
LAB_0026972b:
        pAVar20 = pAVar20 + 1;
        pAVar13 = pAVar13 + 1;
      } while (pAVar20 < pAVar19);
    }
  }
  return;
}

Assistant:

static void
  af_cjk_hint_edges( AF_GlyphHints  hints,
                     AF_Dimension   dim )
  {
    AF_AxisHints  axis       = &hints->axis[dim];
    AF_Edge       edges      = axis->edges;
    AF_Edge       edge_limit = FT_OFFSET( edges, axis->num_edges );
    FT_PtrDist    n_edges;
    AF_Edge       edge;
    AF_Edge       anchor   = NULL;
    FT_Pos        delta    = 0;
    FT_Int        skipped  = 0;
    FT_Bool       has_last_stem = FALSE;
    FT_Pos        last_stem_pos = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_UInt       num_actions = 0;
#endif


    FT_TRACE5(( "cjk %s edge hinting (style `%s')\n",
                dim == AF_DIMENSION_VERT ? "horizontal" : "vertical",
                af_style_names[hints->metrics->style_class->style] ));

    /* we begin by aligning all stems relative to the blue zone */

    if ( AF_HINTS_DO_BLUES( hints ) )
    {
      for ( edge = edges; edge < edge_limit; edge++ )
      {
        AF_Width  blue;
        AF_Edge   edge1, edge2;


        if ( edge->flags & AF_EDGE_DONE )
          continue;

        blue  = edge->blue_edge;
        edge1 = NULL;
        edge2 = edge->link;

        if ( blue )
        {
          edge1 = edge;
        }
        else if ( edge2 && edge2->blue_edge )
        {
          blue  = edge2->blue_edge;
          edge1 = edge2;
          edge2 = edge;
        }

        if ( !edge1 )
          continue;

#ifdef FT_DEBUG_LEVEL_TRACE
        FT_TRACE5(( "  CJKBLUE: edge %ld @%d (opos=%.2f) snapped to %.2f,"
                    " was %.2f\n",
                    edge1 - edges, edge1->fpos, (double)edge1->opos / 64,
                    (double)blue->fit / 64, (double)edge1->pos / 64 ));

        num_actions++;
#endif

        edge1->pos    = blue->fit;
        edge1->flags |= AF_EDGE_DONE;

        if ( edge2 && !edge2->blue_edge )
        {
          af_cjk_align_linked_edge( hints, dim, edge1, edge2 );
          edge2->flags |= AF_EDGE_DONE;

#ifdef FT_DEBUG_LEVEL_TRACE
          num_actions++;
#endif
        }

        if ( !anchor )
          anchor = edge;
      }
    }

    /* now we align all stem edges. */
    for ( edge = edges; edge < edge_limit; edge++ )
    {
      AF_Edge  edge2;


      if ( edge->flags & AF_EDGE_DONE )
        continue;

      /* skip all non-stem edges */
      edge2 = edge->link;
      if ( !edge2 )
      {
        skipped++;
        continue;
      }

      /* Some CJK characters have so many stems that
       * the hinter is likely to merge two adjacent ones.
       * To solve this problem, if either edge of a stem
       * is too close to the previous one, we avoid
       * aligning the two edges, but rather interpolate
       * their locations at the end of this function in
       * order to preserve the space between the stems.
       */
      if ( has_last_stem                       &&
           ( edge->pos  < last_stem_pos + 64 ||
             edge2->pos < last_stem_pos + 64 ) )
      {
        skipped++;
        continue;
      }

      /* now align the stem */

      /* this should not happen, but it's better to be safe */
      if ( edge2->blue_edge )
      {
        FT_TRACE5(( "ASSERTION FAILED for edge %ld\n", edge2-edges ));

        af_cjk_align_linked_edge( hints, dim, edge2, edge );
        edge->flags |= AF_EDGE_DONE;

#ifdef FT_DEBUG_LEVEL_TRACE
        num_actions++;
#endif

        continue;
      }

      if ( edge2 < edge )
      {
        af_cjk_align_linked_edge( hints, dim, edge2, edge );
        edge->flags |= AF_EDGE_DONE;

#ifdef FT_DEBUG_LEVEL_TRACE
        num_actions++;
#endif

        /* We rarely reaches here it seems;
         * usually the two edges belonging
         * to one stem are marked as DONE together
         */
        has_last_stem = TRUE;
        last_stem_pos = edge->pos;
        continue;
      }

      if ( dim != AF_DIMENSION_VERT && !anchor )
      {

#if 0
        if ( fixedpitch )
        {
          AF_Edge     left  = edge;
          AF_Edge     right = edge_limit - 1;
          AF_EdgeRec  left1, left2, right1, right2;
          FT_Pos      target, center1, center2;
          FT_Pos      delta1, delta2, d1, d2;


          while ( right > left && !right->link )
            right--;

          left1  = *left;
          left2  = *left->link;
          right1 = *right->link;
          right2 = *right;

          delta  = ( ( ( hinter->pp2.x + 32 ) & -64 ) - hinter->pp2.x ) / 2;
          target = left->opos + ( right->opos - left->opos ) / 2 + delta - 16;

          delta1  = delta;
          delta1 += af_hint_normal_stem( hints, left, left->link,
                                         delta1, 0 );

          if ( left->link != right )
            af_hint_normal_stem( hints, right->link, right, delta1, 0 );

          center1 = left->pos + ( right->pos - left->pos ) / 2;

          if ( center1 >= target )
            delta2 = delta - 32;
          else
            delta2 = delta + 32;

          delta2 += af_hint_normal_stem( hints, &left1, &left2, delta2, 0 );

          if ( delta1 != delta2 )
          {
            if ( left->link != right )
              af_hint_normal_stem( hints, &right1, &right2, delta2, 0 );

            center2 = left1.pos + ( right2.pos - left1.pos ) / 2;

            d1 = center1 - target;
            d2 = center2 - target;

            if ( FT_ABS( d2 ) < FT_ABS( d1 ) )
            {
              left->pos       = left1.pos;
              left->link->pos = left2.pos;

              if ( left->link != right )
              {
                right->link->pos = right1.pos;
                right->pos       = right2.pos;
              }

              delta1 = delta2;
            }
          }

          delta               = delta1;
          right->link->flags |= AF_EDGE_DONE;
          right->flags       |= AF_EDGE_DONE;
        }
        else

#endif /* 0 */

          delta = af_hint_normal_stem( hints, edge, edge2, 0,
                                       AF_DIMENSION_HORZ );
      }
      else
        af_hint_normal_stem( hints, edge, edge2, delta, dim );

#if 0
      printf( "stem (%d,%d) adjusted (%.1f,%.1f)\n",
               edge - edges, edge2 - edges,
               (double)( edge->pos - edge->opos ) / 64,
               (double)( edge2->pos - edge2->opos ) / 64 );
#endif

      anchor = edge;
      edge->flags  |= AF_EDGE_DONE;
      edge2->flags |= AF_EDGE_DONE;
      has_last_stem = TRUE;
      last_stem_pos = edge2->pos;
    }

    /* make sure that lowercase m's maintain their symmetry */

    /* In general, lowercase m's have six vertical edges if they are sans */
    /* serif, or twelve if they are with serifs.  This implementation is  */
    /* based on that assumption, and seems to work very well with most    */
    /* faces.  However, if for a certain face this assumption is not      */
    /* true, the m is just rendered like before.  In addition, any stem   */
    /* correction will only be applied to symmetrical glyphs (even if the */
    /* glyph is not an m), so the potential for unwanted distortion is    */
    /* relatively low.                                                    */

    /* We don't handle horizontal edges since we can't easily assure that */
    /* the third (lowest) stem aligns with the base line; it might end up */
    /* one pixel higher or lower.                                         */

    n_edges = edge_limit - edges;
    if ( dim == AF_DIMENSION_HORZ && ( n_edges == 6 || n_edges == 12 ) )
    {
      AF_Edge  edge1, edge2, edge3;
      FT_Pos   dist1, dist2, span;


      if ( n_edges == 6 )
      {
        edge1 = edges;
        edge2 = edges + 2;
        edge3 = edges + 4;
      }
      else
      {
        edge1 = edges + 1;
        edge2 = edges + 5;
        edge3 = edges + 9;
      }

      dist1 = edge2->opos - edge1->opos;
      dist2 = edge3->opos - edge2->opos;

      span = dist1 - dist2;
      if ( span < 0 )
        span = -span;

      if ( edge1->link == edge1 + 1 &&
           edge2->link == edge2 + 1 &&
           edge3->link == edge3 + 1 && span < 8 )
      {
        delta = edge3->pos - ( 2 * edge2->pos - edge1->pos );
        edge3->pos -= delta;
        if ( edge3->link )
          edge3->link->pos -= delta;

        /* move the serifs along with the stem */
        if ( n_edges == 12 )
        {
          ( edges + 8 )->pos -= delta;
          ( edges + 11 )->pos -= delta;
        }

        edge3->flags |= AF_EDGE_DONE;
        if ( edge3->link )
          edge3->link->flags |= AF_EDGE_DONE;
      }
    }

    if ( !skipped )
      goto Exit;

    /*
     * now hint the remaining edges (serifs and single) in order
     * to complete our processing
     */
    for ( edge = edges; edge < edge_limit; edge++ )
    {
      if ( edge->flags & AF_EDGE_DONE )
        continue;

      if ( edge->serif )
      {
        af_cjk_align_serif_edge( hints, edge->serif, edge );
        edge->flags |= AF_EDGE_DONE;
        skipped--;
      }
    }

    if ( !skipped )
      goto Exit;

    for ( edge = edges; edge < edge_limit; edge++ )
    {
      AF_Edge  before, after;


      if ( edge->flags & AF_EDGE_DONE )
        continue;

      before = after = edge;

      while ( --before >= edges )
        if ( before->flags & AF_EDGE_DONE )
          break;

      while ( ++after < edge_limit )
        if ( after->flags & AF_EDGE_DONE )
          break;

      if ( before >= edges || after < edge_limit )
      {
        if ( before < edges )
          af_cjk_align_serif_edge( hints, after, edge );
        else if ( after >= edge_limit )
          af_cjk_align_serif_edge( hints, before, edge );
        else
        {
          if ( after->fpos == before->fpos )
            edge->pos = before->pos;
          else
            edge->pos = before->pos +
                        FT_MulDiv( edge->fpos - before->fpos,
                                   after->pos - before->pos,
                                   after->fpos - before->fpos );
        }
      }
    }

  Exit:

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !num_actions )
      FT_TRACE5(( "  (none)\n" ));
    FT_TRACE5(( "\n" ));
#endif

    return;
  }